

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallGenerator::AddInstallRule
          (cmInstallGenerator *this,ostream *os,string *dest,cmInstallType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,bool optional,char *permissions_file,char *permissions_dir,char *rename,
          char *literal_args,Indent indent,char *files_var)

{
  bool bVar1;
  bool bVar2;
  cmScriptGeneratorIndent cVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pbVar7;
  string *f;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_108 [8];
  string absDest;
  string local_b8;
  reference local_98;
  string *file;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  bool firstIteration;
  string local_60 [8];
  string stype;
  bool optional_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  cmInstallType type_local;
  string *dest_local;
  ostream *os_local;
  cmInstallGenerator *this_local;
  Indent indent_local;
  
  this_local._4_4_ = indent.Level;
  stype.field_2._M_local_buf[0xf] = optional;
  std::__cxx11::string::string(local_60);
  switch(type) {
  case cmInstallType_EXECUTABLE:
    std::__cxx11::string::operator=(local_60,"EXECUTABLE");
    break;
  case cmInstallType_STATIC_LIBRARY:
    std::__cxx11::string::operator=(local_60,"STATIC_LIBRARY");
    break;
  case cmInstallType_SHARED_LIBRARY:
    std::__cxx11::string::operator=(local_60,"SHARED_LIBRARY");
    break;
  case cmInstallType_MODULE_LIBRARY:
    std::__cxx11::string::operator=(local_60,"MODULE");
    break;
  case cmInstallType_FILES:
    std::__cxx11::string::operator=(local_60,"FILE");
    break;
  case cmInstallType_PROGRAMS:
    std::__cxx11::string::operator=(local_60,"PROGRAM");
    break;
  case cmInstallType_DIRECTORY:
    std::__cxx11::string::operator=(local_60,"DIRECTORY");
  }
  bVar1 = cmsys::SystemTools::FileIsFullPath(dest);
  if (bVar1) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(files);
    if (!bVar1) {
      poVar4 = ::operator<<(os,this_local._4_4_);
      std::operator<<(poVar4,"list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n");
      poVar4 = ::operator<<(os,this_local._4_4_);
      std::operator<<(poVar4," \"");
      bVar1 = true;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(files);
      file = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(files);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&file), bVar2) {
        local_98 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
        if (!bVar1) {
          std::operator<<(os,";");
        }
        poVar4 = std::operator<<(os,(string *)dest);
        std::operator<<(poVar4,"/");
        if ((rename == (char *)0x0) || (*rename == '\0')) {
          cmsys::SystemTools::GetFilenameName(&local_b8,local_98);
          std::operator<<(os,(string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        else {
          std::operator<<(os,rename);
        }
        bVar1 = false;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::operator<<(os,"\")\n");
    }
    if (files_var != (char *)0x0) {
      poVar4 = ::operator<<(os,this_local._4_4_);
      poVar4 = std::operator<<(poVar4,"foreach(_cmake_abs_file IN LISTS ");
      poVar4 = std::operator<<(poVar4,files_var);
      std::operator<<(poVar4,")\n");
      cVar3 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
      poVar4 = ::operator<<(os,cVar3);
      std::operator<<(poVar4,
                      "get_filename_component(_cmake_abs_file_name \"${_cmake_abs_file}\" NAME)\n");
      cVar3 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
      poVar4 = ::operator<<(os,cVar3);
      poVar4 = std::operator<<(poVar4,"list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES \"");
      poVar4 = std::operator<<(poVar4,(string *)dest);
      std::operator<<(poVar4,"/${_cmake_abs_file_name}\")\n");
      poVar4 = ::operator<<(os,this_local._4_4_);
      std::operator<<(poVar4,"endforeach()\n");
      poVar4 = ::operator<<(os,this_local._4_4_);
      std::operator<<(poVar4,"unset(_cmake_abs_file_name)\n");
      poVar4 = ::operator<<(os,this_local._4_4_);
      std::operator<<(poVar4,"unset(_cmake_abs_file)\n");
    }
    poVar4 = ::operator<<(os,this_local._4_4_);
    std::operator<<(poVar4,"if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    cVar3 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    poVar4 = ::operator<<(os,cVar3);
    std::operator<<(poVar4,
                    "message(WARNING \"ABSOLUTE path INSTALL DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
                   );
    poVar4 = ::operator<<(os,this_local._4_4_);
    std::operator<<(poVar4,"endif()\n");
    poVar4 = ::operator<<(os,this_local._4_4_);
    std::operator<<(poVar4,"if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n");
    absDest.field_2._12_4_ =
         cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)absDest.field_2._12_4_);
    std::operator<<(poVar4,
                    "message(FATAL_ERROR \"ABSOLUTE path INSTALL DESTINATION forbidden (by caller): ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
                   );
    absDest.field_2._8_4_ = this_local._4_4_;
    poVar4 = ::operator<<(os,this_local._4_4_);
    std::operator<<(poVar4,"endif()\n");
  }
  ConvertToAbsoluteDestination((string *)local_108,dest);
  poVar4 = ::operator<<(os,this_local._4_4_);
  poVar4 = std::operator<<(poVar4,"file(INSTALL DESTINATION \"");
  poVar4 = std::operator<<(poVar4,(string *)local_108);
  poVar4 = std::operator<<(poVar4,"\" TYPE ");
  std::operator<<(poVar4,local_60);
  if ((stype.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::operator<<(os," OPTIONAL");
  }
  switch(this->Message) {
  case MessageDefault:
    break;
  case MessageAlways:
    std::operator<<(os," MESSAGE_ALWAYS");
    break;
  case MessageLazy:
    std::operator<<(os," MESSAGE_LAZY");
    break;
  case MessageNever:
    std::operator<<(os," MESSAGE_NEVER");
  }
  if ((permissions_file != (char *)0x0) && (*permissions_file != '\0')) {
    poVar4 = std::operator<<(os," PERMISSIONS");
    std::operator<<(poVar4,permissions_file);
  }
  if ((permissions_dir != (char *)0x0) && (*permissions_dir != '\0')) {
    poVar4 = std::operator<<(os," DIR_PERMISSIONS");
    std::operator<<(poVar4,permissions_dir);
  }
  if ((rename != (char *)0x0) && (*rename != '\0')) {
    poVar4 = std::operator<<(os," RENAME \"");
    poVar4 = std::operator<<(poVar4,rename);
    std::operator<<(poVar4,"\"");
  }
  std::operator<<(os," FILES");
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(files);
  if (sVar5 == 1) {
    poVar4 = std::operator<<(os," \"");
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](files,0);
    poVar4 = std::operator<<(poVar4,(string *)pvVar6);
    std::operator<<(poVar4,"\"");
  }
  else {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
    f = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(files);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&f), bVar1) {
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      poVar4 = std::operator<<(os,"\n");
      poVar4 = ::operator<<(poVar4,this_local._4_4_);
      poVar4 = std::operator<<(poVar4,"  \"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar7);
      std::operator<<(poVar4,"\"");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if (files_var != (char *)0x0) {
      poVar4 = std::operator<<(os," ${");
      poVar4 = std::operator<<(poVar4,files_var);
      std::operator<<(poVar4,"}");
    }
    poVar4 = std::operator<<(os,"\n");
    poVar4 = ::operator<<(poVar4,this_local._4_4_);
    std::operator<<(poVar4," ");
    if ((literal_args == (char *)0x0) || (*literal_args == '\0')) {
      std::operator<<(os," ");
    }
  }
  if ((literal_args != (char *)0x0) && (*literal_args != '\0')) {
    std::operator<<(os,literal_args);
  }
  std::operator<<(os,")\n");
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void cmInstallGenerator::AddInstallRule(
  std::ostream& os, std::string const& dest, cmInstallType type,
  std::vector<std::string> const& files, bool optional /* = false */,
  const char* permissions_file /* = nullptr */,
  const char* permissions_dir /* = nullptr */,
  const char* rename /* = nullptr */, const char* literal_args /* = nullptr */,
  Indent indent, const char* files_var /* = nullptr */)
{
  // Use the FILE command to install the file.
  std::string stype;
  switch (type) {
    case cmInstallType_DIRECTORY:
      stype = "DIRECTORY";
      break;
    case cmInstallType_PROGRAMS:
      stype = "PROGRAM";
      break;
    case cmInstallType_EXECUTABLE:
      stype = "EXECUTABLE";
      break;
    case cmInstallType_STATIC_LIBRARY:
      stype = "STATIC_LIBRARY";
      break;
    case cmInstallType_SHARED_LIBRARY:
      stype = "SHARED_LIBRARY";
      break;
    case cmInstallType_MODULE_LIBRARY:
      stype = "MODULE";
      break;
    case cmInstallType_FILES:
      stype = "FILE";
      break;
  }
  if (cmSystemTools::FileIsFullPath(dest)) {
    if (!files.empty()) {
      os << indent << "list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n";
      os << indent << " \"";
      bool firstIteration = true;
      for (std::string const& file : files) {
        if (!firstIteration) {
          os << ";";
        }
        os << dest << "/";
        if (rename && *rename) {
          os << rename;
        } else {
          os << cmSystemTools::GetFilenameName(file);
        }
        firstIteration = false;
      }
      os << "\")\n";
    }
    if (files_var) {
      os << indent << "foreach(_cmake_abs_file IN LISTS " << files_var
         << ")\n";
      os << indent.Next()
         << "get_filename_component(_cmake_abs_file_name "
            "\"${_cmake_abs_file}\" NAME)\n";
      os << indent.Next() << "list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES \""
         << dest << "/${_cmake_abs_file_name}\")\n";
      os << indent << "endforeach()\n";
      os << indent << "unset(_cmake_abs_file_name)\n";
      os << indent << "unset(_cmake_abs_file)\n";
    }
    os << indent << "if(CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent.Next()
       << "message(WARNING \"ABSOLUTE path INSTALL "
          "DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";

    os << indent << "if(CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n";
    os << indent.Next()
       << "message(FATAL_ERROR \"ABSOLUTE path INSTALL "
          "DESTINATION forbidden (by caller): "
          "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n";
    os << indent << "endif()\n";
  }
  std::string absDest = ConvertToAbsoluteDestination(dest);
  os << indent << "file(INSTALL DESTINATION \"" << absDest << "\" TYPE "
     << stype;
  if (optional) {
    os << " OPTIONAL";
  }
  switch (this->Message) {
    case MessageDefault:
      break;
    case MessageAlways:
      os << " MESSAGE_ALWAYS";
      break;
    case MessageLazy:
      os << " MESSAGE_LAZY";
      break;
    case MessageNever:
      os << " MESSAGE_NEVER";
      break;
  }
  if (permissions_file && *permissions_file) {
    os << " PERMISSIONS" << permissions_file;
  }
  if (permissions_dir && *permissions_dir) {
    os << " DIR_PERMISSIONS" << permissions_dir;
  }
  if (rename && *rename) {
    os << " RENAME \"" << rename << "\"";
  }
  os << " FILES";
  if (files.size() == 1) {
    os << " \"" << files[0] << "\"";
  } else {
    for (std::string const& f : files) {
      os << "\n" << indent << "  \"" << f << "\"";
    }
    if (files_var) {
      os << " ${" << files_var << "}";
    }
    os << "\n" << indent << " ";
    if (!(literal_args && *literal_args)) {
      os << " ";
    }
  }
  if (literal_args && *literal_args) {
    os << literal_args;
  }
  os << ")\n";
}